

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_from_part_status(REF_INTERP ref_interp,REF_INT *from_part)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_GLOB n_moving;
  REF_GLOB n_set;
  REF_NODE from_node;
  REF_GRID from_grid;
  REF_MPI ref_mpi;
  REF_INT *from_part_local;
  REF_INTERP ref_interp_local;
  
  from_grid = (REF_GRID)ref_interp->ref_mpi;
  from_node = (REF_NODE)ref_interp->from_grid;
  n_set = (REF_GLOB)((REF_GRID)from_node)->node;
  n_moving = 0;
  _ref_private_macro_code_rss = 0;
  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ((REF_NODE)n_set)->max;
      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
    if (((((-1 < ref_private_macro_code_rss_1) &&
          (ref_private_macro_code_rss_1 < ((REF_NODE)n_set)->max)) &&
         (-1 < ((REF_NODE)n_set)->global[ref_private_macro_code_rss_1])) &&
        ((((REF_NODE)n_set)->ref_mpi->id == ((REF_NODE)n_set)->part[ref_private_macro_code_rss_1] &&
         (from_part[ref_private_macro_code_rss_1] != -1)))) &&
       (n_moving = n_moving + 1,
       from_part[ref_private_macro_code_rss_1] !=
       ((REF_NODE)n_set)->part[ref_private_macro_code_rss_1])) {
      _ref_private_macro_code_rss = _ref_private_macro_code_rss + 1;
    }
  }
  ref_mpi = (REF_MPI)from_part;
  from_part_local = (REF_INT *)ref_interp;
  uVar1 = ref_mpi_allsum((REF_MPI)from_grid,&n_moving,1,2);
  if (uVar1 == 0) {
    uVar1 = ref_mpi_allsum((REF_MPI)from_grid,&ref_private_macro_code_rss,1,2);
    if (uVar1 == 0) {
      if (((*(int *)((long)&from_grid->mpi + 4) == 0) && (0 < *(long *)(n_set + 0x68))) &&
         (0 < n_moving)) {
        printf(" %6.2f %% %ld set %6.2f %% %ld moving of %ld recept nodes\n",
               ((double)n_moving * 100.0) / (double)*(long *)(n_set + 0x68),
               ((double)_ref_private_macro_code_rss * 100.0) / (double)n_moving,n_moving,
               _ref_private_macro_code_rss,*(undefined8 *)(n_set + 0x68));
      }
      ref_interp_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0xa6f,"ref_interp_from_part_status",(ulong)uVar1,"sum n moving");
      ref_interp_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xa6e,
           "ref_interp_from_part_status",(ulong)uVar1,"sum n set");
    ref_interp_local._4_4_ = uVar1;
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_from_part_status(REF_INTERP ref_interp,
                                                      REF_INT *from_part) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);

  REF_GLOB n_set, n_moving;
  REF_INT node;

  n_set = 0;
  n_moving = 0;
  each_ref_node_valid_node(from_node, node) {
    if (ref_node_owned(from_node, node) && REF_EMPTY != from_part[node]) {
      n_set++;
      if (from_part[node] != ref_node_part(from_node, node)) {
        n_moving++;
      }
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, &n_set, 1, REF_LONG_TYPE), "sum n set");
  RSS(ref_mpi_allsum(ref_mpi, &n_moving, 1, REF_LONG_TYPE), "sum n moving");
  if (ref_mpi_once(ref_mpi) && 0 < ref_node_n_global(from_node) && 0 < n_set) {
    printf(" %6.2f %% " REF_GLOB_FMT " set %6.2f %% " REF_GLOB_FMT
           " moving of " REF_GLOB_FMT " recept nodes\n",
           100.0 * (REF_DBL)n_set / (REF_DBL)ref_node_n_global(from_node),
           n_set, 100.0 * (REF_DBL)n_moving / (REF_DBL)n_set, n_moving,
           ref_node_n_global(from_node));
  }
  return REF_SUCCESS;
}